

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

void Gia_ManCheckResub(Vec_Ptr_t *vDivs,int nWords)

{
  int Entry;
  int iVar1;
  word *p;
  word *p_00;
  Vec_Int_t *p_01;
  word *p_02;
  uint local_68;
  int Value;
  int Mint;
  int v;
  Vec_Int_t *vValue;
  word *pOn;
  word *pOff;
  int pVarSet [10];
  uint local_18;
  int nVars;
  int i;
  int nWords_local;
  Vec_Ptr_t *vDivs_local;
  
  pVarSet[9] = 3;
  memset(&pOff,0,0x28);
  pOff._0_4_ = 2;
  pOff._4_4_ = 3;
  pVarSet[0] = 4;
  p = (word *)Vec_PtrEntry(vDivs,0);
  p_00 = (word *)Vec_PtrEntry(vDivs,1);
  p_01 = Vec_IntStartFull(0x40);
  printf("Verifying resub:\n");
  for (local_18 = 0; (int)local_18 < nWords * 0x40; local_18 = local_18 + 1) {
    local_68 = 0;
    Entry = Abc_TtGetBit(p_00,local_18);
    iVar1 = Abc_TtGetBit(p,local_18);
    if ((iVar1 != 0) || (Entry != 0)) {
      for (Value = 0; Value < pVarSet[9]; Value = Value + 1) {
        p_02 = (word *)Vec_PtrEntry(vDivs,pVarSet[(long)Value + -2]);
        iVar1 = Abc_TtGetBit(p_02,local_18);
        if (iVar1 != 0) {
          local_68 = 1 << ((byte)Value & 0x1f) | local_68;
        }
      }
      iVar1 = Vec_IntEntry(p_01,local_68);
      if (iVar1 == -1) {
        Vec_IntWriteEntry(p_01,local_68,Entry);
      }
      else {
        iVar1 = Vec_IntEntry(p_01,local_68);
        if (iVar1 != Entry) {
          printf("Mismatch in pattern %d\n",(ulong)local_18);
        }
      }
    }
  }
  printf("Finished verifying resub.\n");
  Vec_IntFree(p_01);
  return;
}

Assistant:

void Gia_ManCheckResub( Vec_Ptr_t * vDivs, int nWords )
{
    //int i, nVars = 6, pVarSet[10] = { 2, 189, 2127, 2125, 177, 178 };
    int i, nVars = 3, pVarSet[10] = { 2, 3, 4 };
    word * pOff = (word *)Vec_PtrEntry( vDivs, 0 );
    word * pOn  = (word *)Vec_PtrEntry( vDivs, 1 );
    Vec_Int_t * vValue = Vec_IntStartFull( 1 << 6 );
    printf( "Verifying resub:\n" );
    for ( i = 0; i < 64*nWords; i++ )
    {
        int v, Mint = 0, Value = Abc_TtGetBit(pOn, i);
        if ( !Abc_TtGetBit(pOff, i) && !Value )
            continue;
        for ( v = 0; v < nVars; v++ )
            if ( Abc_TtGetBit((word *)Vec_PtrEntry(vDivs, pVarSet[v]), i) )
                Mint |= 1 << v;
        if ( Vec_IntEntry(vValue, Mint) == -1 )
            Vec_IntWriteEntry(vValue, Mint, Value);
        else if ( Vec_IntEntry(vValue, Mint) != Value )
            printf( "Mismatch in pattern %d\n", i );
    }
    printf( "Finished verifying resub.\n" );
    Vec_IntFree( vValue );
}